

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O3

void ma_momentum_derive(ga_twist *xd,ma_momentum *p,ma_wrench *r)

{
  frame *pfVar1;
  frame *pfVar2;
  point *ppVar3;
  
  if (xd == (ga_twist *)0x0) {
    __assert_fail("xd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x2e,
                  "void ma_momentum_derive(const struct ga_twist *, const struct ma_momentum *, struct ma_wrench *)"
                 );
  }
  if (p == (ma_momentum *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x2f,
                  "void ma_momentum_derive(const struct ga_twist *, const struct ma_momentum *, struct ma_wrench *)"
                 );
  }
  if (r == (ma_wrench *)0x0) {
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x30,
                  "void ma_momentum_derive(const struct ga_twist *, const struct ma_momentum *, struct ma_wrench *)"
                 );
  }
  pfVar1 = xd->frame;
  if (pfVar1 == (frame *)0x0) {
    __assert_fail("xd->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x31,
                  "void ma_momentum_derive(const struct ga_twist *, const struct ma_momentum *, struct ma_wrench *)"
                 );
  }
  pfVar2 = p->frame;
  if (pfVar2 == (frame *)0x0) {
    __assert_fail("p->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x32,
                  "void ma_momentum_derive(const struct ga_twist *, const struct ma_momentum *, struct ma_wrench *)"
                 );
  }
  ppVar3 = xd->point;
  if (pfVar1->origin != ppVar3) {
    __assert_fail("xd->frame->origin == xd->point",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x33,
                  "void ma_momentum_derive(const struct ga_twist *, const struct ma_momentum *, struct ma_wrench *)"
                 );
  }
  if (pfVar2->origin != p->point) {
    __assert_fail("p->frame->origin == p->point",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x34,
                  "void ma_momentum_derive(const struct ga_twist *, const struct ma_momentum *, struct ma_wrench *)"
                 );
  }
  if (xd->target_body == p->body) {
    if (pfVar1->origin != pfVar2->origin) {
      __assert_fail("xd->point == p->point",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                    ,0x36,
                    "void ma_momentum_derive(const struct ga_twist *, const struct ma_momentum *, struct ma_wrench *)"
                   );
    }
    if (pfVar1 == pfVar2) {
      r->body = xd->target_body;
      r->point = ppVar3;
      r->frame = pfVar1;
      return;
    }
    __assert_fail("xd->frame == p->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                  ,0x37,
                  "void ma_momentum_derive(const struct ga_twist *, const struct ma_momentum *, struct ma_wrench *)"
                 );
  }
  __assert_fail("xd->target_body == p->body",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,0x35,
                "void ma_momentum_derive(const struct ga_twist *, const struct ma_momentum *, struct ma_wrench *)"
               );
}

Assistant:

void ma_momentum_derive(
        const struct ga_twist *xd,
        const struct ma_momentum *p,
        struct ma_wrench *r)
{
    assert(xd);
    assert(p);
    assert(r);
    assert(xd->frame);
    assert(p->frame);
    assert(xd->frame->origin == xd->point);     // screw twist
    assert(p->frame->origin == p->point);       // wrench
    assert(xd->target_body == p->body);
    assert(xd->point == p->point);
    assert(xd->frame == p->frame);

    r->body = xd->target_body;
    r->point = xd->point;
    r->frame = xd->frame;
}